

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O2

void __thiscall
duckdb::GeoParquetFileMetadata::Write(GeoParquetFileMetadata *this,FileMetaData *file_meta_data)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  yyjson_alc *alc;
  yyjson_val_uni yVar3;
  pointer pcVar4;
  long lVar5;
  _Hash_node_base __s;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  FileMetaData *pFVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  yyjson_mut_doc *doc;
  size_t sVar12;
  yyjson_mut_val *pyVar13;
  char *pcVar14;
  _Rb_tree_node_base *p_Var15;
  ulong uVar16;
  ulong uVar17;
  yyjson_doc *pyVar18;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  InvalidInputException *this_00;
  SerializationException *this_01;
  uint64_t uVar19;
  yyjson_mut_val *pyVar20;
  __node_base *p_Var21;
  yyjson_mut_val *pyVar22;
  yyjson_mut_val *local_110;
  yyjson_mut_val *local_f8;
  allocator local_d1;
  undefined8 local_d0;
  string local_c8;
  FileMetaData *local_a8;
  yyjson_str_pool *local_a0;
  size_t len;
  KeyValue kv;
  yyjson_write_err err;
  
  local_a8 = file_meta_data;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) {
    local_110 = (yyjson_mut_val *)0x0;
    bVar10 = false;
    goto LAB_01dc4706;
  }
  pyVar1 = &doc->val_pool;
  pyVar13 = (doc->val_pool).cur;
  if ((doc->val_pool).end == pyVar13) {
    bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
    if (bVar10) {
      pyVar13 = pyVar1->cur;
      goto LAB_01dc43ce;
    }
LAB_01dc5391:
    pyVar13 = (yyjson_mut_val *)0x0;
  }
  else {
LAB_01dc43ce:
    pyVar1->cur = pyVar13 + 1;
    if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_01dc5391;
    pyVar13->tag = 7;
  }
  doc->root = pyVar13;
  pcVar4 = (this->version)._M_dataplus._M_p;
  if (((pcVar4 != (pointer)0x0) && (pyVar13 != (yyjson_mut_val *)0x0)) &&
     ((~(uint)pyVar13->tag & 7) == 0)) {
    uVar17 = (this->version)._M_string_length;
    pyVar20 = (doc->val_pool).cur;
    if ((ulong)(((long)(doc->val_pool).end - (long)pyVar20) / 0x18) < 2) {
      bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
      if (!bVar10) goto LAB_01dc4504;
      pyVar20 = pyVar1->cur;
    }
    pyVar1->cur = pyVar20 + 2;
    if (pyVar20 != (yyjson_mut_val *)0x0) {
      uVar16 = pyVar13->tag;
      pyVar20->tag = 0x70d;
      (pyVar20->uni).str = "version";
      pyVar2 = &doc->str_pool;
      pcVar14 = (doc->str_pool).cur;
      if (uVar17 < (ulong)((long)(doc->str_pool).end - (long)pcVar14)) {
LAB_01dc4480:
        pyVar2->cur = pcVar14 + uVar17 + 1;
        if (pcVar14 != (char *)0x0) {
          switchD_01939fa4::default(pcVar14,pcVar4,uVar17);
          pcVar14[uVar17] = '\0';
          pyVar20[1].uni.ptr = pcVar14;
          pyVar20[1].tag = uVar17 << 8 | 5;
          pyVar22 = pyVar20;
          if (0xff < uVar16) {
            lVar5 = *(long *)((pyVar13->uni).u64 + 0x10);
            pyVar22 = *(yyjson_mut_val **)(lVar5 + 0x10);
            *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
          }
          pyVar20[1].next = pyVar22;
          pyVar20->next = pyVar20 + 1;
          (pyVar13->uni).u64 = (uint64_t)pyVar20;
          pyVar13->tag = (ulong)(byte)pyVar13->tag + (uVar16 & 0xffffffffffffff00) + 0x100;
          goto LAB_01dc4504;
        }
      }
      else {
        bVar10 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,uVar17 + 1);
        if (bVar10) {
          pcVar14 = pyVar2->cur;
          goto LAB_01dc4480;
        }
      }
      pyVar20[1].uni.u64 = 0;
    }
  }
LAB_01dc4504:
  pcVar4 = (this->primary_geometry_column)._M_dataplus._M_p;
  if (pcVar4 == (pointer)0x0) {
    if (doc != (yyjson_mut_doc *)0x0) goto LAB_01dc4622;
LAB_01dc5378:
    pyVar20 = (yyjson_mut_val *)0x0;
    bVar10 = false;
LAB_01dc5383:
    local_110 = (yyjson_mut_val *)0x0;
  }
  else {
    if (doc == (yyjson_mut_doc *)0x0) goto LAB_01dc5378;
    if (pyVar13 == (yyjson_mut_val *)0x0) {
      pyVar13 = (yyjson_mut_val *)0x0;
    }
    else if ((~(uint)pyVar13->tag & 7) == 0) {
      uVar17 = (this->primary_geometry_column)._M_string_length;
      pyVar20 = (doc->val_pool).cur;
      if ((ulong)(((long)(doc->val_pool).end - (long)pyVar20) / 0x18) < 2) {
        bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar10) goto LAB_01dc4622;
        pyVar20 = pyVar1->cur;
      }
      pyVar1->cur = pyVar20 + 2;
      if (pyVar20 != (yyjson_mut_val *)0x0) {
        uVar16 = pyVar13->tag;
        pyVar20->tag = 0xe0d;
        (pyVar20->uni).str = "primary_column";
        pyVar2 = &doc->str_pool;
        pcVar14 = (doc->str_pool).cur;
        if (uVar17 < (ulong)((long)(doc->str_pool).end - (long)pcVar14)) {
LAB_01dc459e:
          pyVar2->cur = pcVar14 + uVar17 + 1;
          if (pcVar14 != (char *)0x0) {
            switchD_01939fa4::default(pcVar14,pcVar4,uVar17);
            pcVar14[uVar17] = '\0';
            pyVar20[1].uni.ptr = pcVar14;
            pyVar20[1].tag = uVar17 << 8 | 5;
            pyVar22 = pyVar20;
            if (0xff < uVar16) {
              lVar5 = *(long *)((pyVar13->uni).u64 + 0x10);
              pyVar22 = *(yyjson_mut_val **)(lVar5 + 0x10);
              *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
            }
            pyVar20[1].next = pyVar22;
            pyVar20->next = pyVar20 + 1;
            (pyVar13->uni).u64 = (uint64_t)pyVar20;
            pyVar13->tag = (ulong)(byte)pyVar13->tag + (uVar16 & 0xffffffffffffff00) + 0x100;
            goto LAB_01dc4622;
          }
        }
        else {
          bVar10 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,uVar17 + 1);
          if (bVar10) {
            pcVar14 = pyVar2->cur;
            goto LAB_01dc459e;
          }
        }
        pyVar20[1].uni.u64 = 0;
      }
    }
LAB_01dc4622:
    pyVar20 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar20) {
      bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      local_110 = (doc->val_pool).cur;
      pyVar20 = local_110;
      if (bVar10) goto LAB_01dc4632;
LAB_01dc53b9:
      pyVar20 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_01dc4632:
      local_110 = pyVar20 + 1;
      pyVar1->cur = local_110;
      if (pyVar20 == (yyjson_mut_val *)0x0) goto LAB_01dc53b9;
      pyVar20->tag = 0x70d;
      (pyVar20->uni).f64 = (double)"columns";
      local_110 = pyVar1->cur;
    }
    if ((doc->val_pool).end == local_110) {
      bVar10 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (bVar10) {
        local_110 = pyVar1->cur;
        goto LAB_01dc4664;
      }
      bVar10 = true;
      goto LAB_01dc5383;
    }
LAB_01dc4664:
    pyVar1->cur = local_110 + 1;
    bVar10 = true;
    if (local_110 == (yyjson_mut_val *)0x0) goto LAB_01dc5383;
    local_110->tag = 7;
  }
  if (((pyVar13 == (yyjson_mut_val *)0x0) || (pyVar20 == (yyjson_mut_val *)0x0)) ||
     ((uVar17 = pyVar13->tag, ((uint)uVar17 & 7) != 7 ||
      ((local_110 == (yyjson_mut_val *)0x0 || (((uint)pyVar20->tag & 7) != 5)))))) {
    local_110 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar22 = pyVar20;
    if (0xff < uVar17) {
      lVar5 = *(long *)((pyVar13->uni).u64 + 0x10);
      pyVar22 = *(yyjson_mut_val **)(lVar5 + 0x10);
      *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
    }
    local_110->next = pyVar22;
    pyVar20->next = local_110;
    (pyVar13->uni).str = (char *)pyVar20;
    pyVar13->tag = (uVar17 & 0xff) + (uVar17 & 0xffffffffffffff00) + 0x100;
  }
LAB_01dc4706:
  p_Var21 = &(this->geometry_columns)._M_h._M_before_begin;
  pyVar1 = &doc->val_pool;
  alc = &doc->alc;
  local_a0 = &doc->str_pool;
  do {
    do {
      p_Var21 = p_Var21->_M_nxt;
      if (p_Var21 == (__node_base *)0x0) {
        pcVar14 = duckdb_yyjson::yyjson_mut_write_opts(doc,0,(yyjson_alc *)0x0,&len,&err);
        if (pcVar14 == (char *)0x0) {
          duckdb_yyjson::yyjson_mut_doc_free(doc);
          this_01 = (SerializationException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&kv,"Failed to write JSON string: %s",(allocator *)&local_c8);
          SerializationException::SerializationException<char_const*>(this_01,(string *)&kv,err.msg)
          ;
          __cxa_throw(this_01,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        duckdb_parquet::KeyValue::KeyValue(&kv);
        ::std::__cxx11::string::string((string *)&local_c8,"geo",&local_d1);
        duckdb_parquet::KeyValue::__set_key(&kv,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar14,pcVar14 + len)
        ;
        duckdb_parquet::KeyValue::__set_value(&kv,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        free(pcVar14);
        duckdb_yyjson::yyjson_mut_doc_free(doc);
        pFVar8 = local_a8;
        ::std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::
        push_back(&(local_a8->key_value_metadata).
                   super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                  ,&kv);
        pFVar8->__isset = (_FileMetaData__isset)((byte)pFVar8->__isset | 1);
        duckdb_parquet::KeyValue::~KeyValue(&kv);
        return;
      }
      __s._M_nxt = p_Var21[1]._M_nxt;
      if (__s._M_nxt == (_Hash_node_base *)0x0 || !bVar10) {
        pyVar20 = (yyjson_mut_val *)0x0;
        pyVar13 = (yyjson_mut_val *)0x0;
        local_f8 = (yyjson_mut_val *)0x0;
        if (doc != (yyjson_mut_doc *)0x0) goto LAB_01dc4798;
      }
      else {
        sVar12 = strlen((char *)__s._M_nxt);
        pyVar20 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar20) {
          bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar9) {
            pyVar20 = pyVar1->cur;
            goto LAB_01dc4773;
          }
        }
        else {
LAB_01dc4773:
          pyVar1->cur = pyVar20 + 1;
          if (pyVar20 != (yyjson_mut_val *)0x0) {
            pyVar20->tag = sVar12 << 8 | 5;
            (pyVar20->uni).str = (char *)__s._M_nxt;
            goto LAB_01dc4798;
          }
        }
        pyVar20 = (yyjson_mut_val *)0x0;
LAB_01dc4798:
        local_f8 = (doc->val_pool).cur;
        if ((doc->val_pool).end == local_f8) {
          bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          pyVar13 = (yyjson_mut_val *)CONCAT71(extraout_var,bVar9);
          if (bVar9) {
            local_f8 = pyVar1->cur;
            goto LAB_01dc47a8;
          }
        }
        else {
LAB_01dc47a8:
          pyVar13 = local_f8 + 1;
          pyVar1->cur = pyVar13;
          if (local_f8 != (yyjson_mut_val *)0x0) {
            local_f8->tag = 7;
            goto LAB_01dc47c5;
          }
        }
        local_f8 = (yyjson_mut_val *)0x0;
      }
LAB_01dc47c5:
      if ((local_110 == (yyjson_mut_val *)0x0) || (pyVar20 == (yyjson_mut_val *)0x0)) {
LAB_01dc4905:
        pyVar22 = (yyjson_mut_val *)0x0;
LAB_01dc4908:
        local_f8 = pyVar22;
        if (bVar10) {
LAB_01dc4913:
          pyVar20 = (doc->val_pool).cur;
          if ((doc->val_pool).end == pyVar20) {
            bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            if (bVar9) {
              pyVar20 = pyVar1->cur;
              goto LAB_01dc4923;
            }
          }
          else {
LAB_01dc4923:
            pyVar1->cur = pyVar20 + 1;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              pyVar20->tag = 0xe0d;
              (pyVar20->uni).f64 = (double)"geometry_types";
              goto LAB_01dc4949;
            }
          }
          pyVar20 = (yyjson_mut_val *)0x0;
LAB_01dc4949:
          pyVar22 = (doc->val_pool).cur;
          if ((doc->val_pool).end == pyVar22) {
            bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            pyVar13 = (yyjson_mut_val *)CONCAT71(extraout_var_00,bVar9);
            if (bVar9) {
              pyVar22 = pyVar1->cur;
              goto LAB_01dc4959;
            }
          }
          else {
LAB_01dc4959:
            pyVar13 = pyVar22 + 1;
            pyVar1->cur = pyVar13;
            if (pyVar22 != (yyjson_mut_val *)0x0) {
              pyVar22->tag = 6;
              goto LAB_01dc4971;
            }
          }
          pyVar22 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar20 = (yyjson_mut_val *)0x0;
          pyVar22 = (yyjson_mut_val *)0x0;
          if (doc != (yyjson_mut_doc *)0x0) goto LAB_01dc4949;
        }
LAB_01dc4971:
        if (local_f8 != (yyjson_mut_val *)0x0) goto LAB_01dc497f;
        local_d0 = CONCAT71((int7)((ulong)pyVar13 >> 8),1);
        local_f8 = (yyjson_mut_val *)0x0;
LAB_01dc4a1c:
        pyVar22 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar13 = (yyjson_mut_val *)local_110->tag;
        pyVar22 = (yyjson_mut_val *)0x0;
        if (((uint)pyVar13 & 7) != 7) goto LAB_01dc4908;
        if (local_f8 == (yyjson_mut_val *)0x0) goto LAB_01dc4905;
        pyVar22 = (yyjson_mut_val *)0x0;
        if (((uint)pyVar20->tag & 7) != 5) goto LAB_01dc4908;
        pyVar22 = pyVar20;
        if ((yyjson_mut_val *)0xff < pyVar13) {
          lVar5 = *(long *)((local_110->uni).u64 + 0x10);
          pyVar22 = *(yyjson_mut_val **)(lVar5 + 0x10);
          *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
        }
        local_f8->next = pyVar22;
        pyVar20->next = local_f8;
        (local_110->uni).str = (char *)pyVar20;
        local_110->tag = ((ulong)pyVar13 & 0xff) + ((ulong)pyVar13 & 0xffffffffffffff00) + 0x100;
        if (doc != (yyjson_mut_doc *)0x0) {
          uVar11 = ~(uint)local_f8->tag;
          pyVar13 = (yyjson_mut_val *)(ulong)uVar11;
          pyVar22 = local_f8;
          if ((uVar11 & 7) == 0) {
            pyVar20 = (doc->val_pool).cur;
            if ((ulong)(((long)(doc->val_pool).end - (long)pyVar20) / 0x18) < 2) {
              bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
              pyVar13 = (yyjson_mut_val *)CONCAT71(extraout_var_01,bVar9);
              if (!bVar9) goto LAB_01dc4908;
              pyVar20 = pyVar1->cur;
            }
            pyVar13 = pyVar20 + 2;
            pyVar1->cur = pyVar13;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              uVar17 = local_f8->tag;
              pyVar20->tag = 0x80d;
              (pyVar20->uni).str = "encoding";
              pyVar20[1].tag = 0x30d;
              pyVar20[1].uni.str = "WKB";
              pyVar13 = pyVar20;
              if (0xff < uVar17) {
                lVar5 = *(long *)((local_f8->uni).u64 + 0x10);
                pyVar13 = *(yyjson_mut_val **)(lVar5 + 0x10);
                *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
              }
              pyVar20[1].next = pyVar13;
              pyVar20->next = pyVar20 + 1;
              (local_f8->uni).u64 = (uint64_t)pyVar20;
              pyVar13 = (yyjson_mut_val *)
                        ((uVar17 & 0xffffffffffffff00) + (ulong)(byte)local_f8->tag + 0x100);
              local_f8->tag = (uint64_t)pyVar13;
            }
          }
          goto LAB_01dc4908;
        }
        if (bVar10) goto LAB_01dc4913;
        pyVar22 = (yyjson_mut_val *)0x0;
        pyVar20 = (yyjson_mut_val *)0x0;
LAB_01dc497f:
        local_d0 = 0;
        if ((((pyVar20 == (yyjson_mut_val *)0x0) ||
             (uVar17 = local_f8->tag, ((uint)uVar17 & 7) != 7)) ||
            (local_d0 = 0, pyVar22 == (yyjson_mut_val *)0x0)) || (((uint)pyVar20->tag & 7) != 5))
        goto LAB_01dc4a1c;
        pyVar13 = pyVar20;
        if (0xff < uVar17) {
          lVar5 = *(long *)((local_f8->uni).u64 + 0x10);
          pyVar13 = *(yyjson_mut_val **)(lVar5 + 0x10);
          *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
        }
        pyVar22->next = pyVar13;
        pyVar20->next = pyVar22;
        (local_f8->uni).str = (char *)pyVar20;
        local_f8->tag = (uVar17 & 0xff) + (uVar17 & 0xffffffffffffff00) + 0x100;
        local_d0 = 0;
      }
      for (p_Var15 = (_Rb_tree_node_base *)p_Var21[9]._M_nxt;
          p_Var15 != (_Rb_tree_node_base *)(p_Var21 + 7);
          p_Var15 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var15)) {
        pcVar14 = WKBGeometryTypes::ToString((WKBGeometryType)p_Var15[1]._M_color);
        if ((pyVar22 != (yyjson_mut_val *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
           (uVar19 = pyVar22->tag, ((uint)uVar19 & 7) == 6)) {
          if (bVar10) {
            sVar12 = strlen(pcVar14);
            pyVar13 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar13) {
              bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar9) {
                pyVar13 = pyVar1->cur;
                goto LAB_01dc4a94;
              }
LAB_01dc4b28:
              pyVar13 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_01dc4a94:
              pyVar1->cur = pyVar13 + 1;
              if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_01dc4b28;
              pyVar13->tag = sVar12 << 8 | 5;
              (pyVar13->uni).str = pcVar14;
            }
            uVar19 = pyVar22->tag;
          }
          else {
            pyVar13 = (yyjson_mut_val *)0x0;
          }
          if ((pyVar13 != (yyjson_mut_val *)0x0) && (((uint)uVar19 & 7) == 6)) {
            pyVar22->tag = (uVar19 & 0xfffffffffffffffe) + 0x100;
            pyVar20 = pyVar13;
            if (0xff < uVar19) {
              pyVar20 = *(yyjson_mut_val **)((pyVar22->uni).u64 + 0x10);
              *(yyjson_mut_val **)((pyVar22->uni).u64 + 0x10) = pyVar13;
            }
            pyVar13->next = pyVar20;
            (pyVar22->uni).str = (char *)pyVar13;
          }
        }
      }
      if (bVar10) {
        pyVar13 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar13) {
          bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar9) {
            pyVar13 = pyVar1->cur;
            goto LAB_01dc4b55;
          }
        }
        else {
LAB_01dc4b55:
          pyVar1->cur = pyVar13 + 1;
          if (pyVar13 != (yyjson_mut_val *)0x0) {
            pyVar13->tag = 0x40d;
            (pyVar13->uni).f64 = (double)"bbox";
            goto LAB_01dc4b78;
          }
        }
        pyVar13 = (yyjson_mut_val *)0x0;
LAB_01dc4b78:
        pyVar20 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar20) {
          bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar9) {
            pyVar20 = pyVar1->cur;
            goto LAB_01dc4b88;
          }
        }
        else {
LAB_01dc4b88:
          pyVar1->cur = pyVar20 + 1;
          if (pyVar20 != (yyjson_mut_val *)0x0) {
            pyVar20->tag = 6;
            goto LAB_01dc4ba0;
          }
        }
        pyVar20 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar13 = (yyjson_mut_val *)0x0;
        pyVar20 = (yyjson_mut_val *)0x0;
        if (doc != (yyjson_mut_doc *)0x0) goto LAB_01dc4b78;
      }
LAB_01dc4ba0:
      if (((((char)local_d0 == '\0') && (pyVar13 != (yyjson_mut_val *)0x0)) &&
          (uVar17 = local_f8->tag, ((uint)uVar17 & 7) == 7)) &&
         ((pyVar20 != (yyjson_mut_val *)0x0 && (((uint)pyVar13->tag & 7) == 5)))) {
        pyVar22 = pyVar13;
        if (0xff < uVar17) {
          lVar5 = *(long *)((local_f8->uni).u64 + 0x10);
          pyVar22 = *(yyjson_mut_val **)(lVar5 + 0x10);
          *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar13;
        }
        pyVar20->next = pyVar22;
        pyVar13->next = pyVar20;
        (local_f8->uni).str = (char *)pyVar13;
        local_f8->tag = (uVar17 & 0xff) + (uVar17 & 0xffffffffffffff00) + 0x100;
        if (doc != (yyjson_mut_doc *)0x0) {
          uVar17 = pyVar20->tag;
          if (((uint)pyVar20->tag & 7) == 6) {
            yVar3 = *(yyjson_val_uni *)(p_Var21 + 0xc);
            pyVar13 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar13) {
              bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar9) {
                pyVar13 = pyVar1->cur;
                goto LAB_01dc4c53;
              }
LAB_01dc5183:
              pyVar13 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_01dc4c53:
              pyVar1->cur = pyVar13 + 1;
              if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_01dc5183;
              pyVar13->tag = 0x14;
              pyVar13->uni = yVar3;
            }
            uVar17 = pyVar20->tag;
            if ((pyVar13 != (yyjson_mut_val *)0x0) && (((uint)uVar17 & 7) == 6)) {
              uVar16 = (uVar17 & 0xfffffffffffffffe) + 0x100;
              pyVar20->tag = uVar16;
              pyVar22 = pyVar13;
              if (0xff < uVar17) {
                pyVar22 = *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10);
                *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10) = pyVar13;
              }
              pyVar13->next = pyVar22;
              (pyVar20->uni).str = (char *)pyVar13;
              uVar17 = uVar16;
            }
          }
          if (((uint)uVar17 & 7) == 6) {
            yVar3 = *(yyjson_val_uni *)(p_Var21 + 0xe);
            pyVar13 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar13) {
              bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar9) {
                pyVar13 = pyVar1->cur;
                goto LAB_01dc4cd8;
              }
LAB_01dc51b1:
              pyVar13 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_01dc4cd8:
              pyVar1->cur = pyVar13 + 1;
              if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_01dc51b1;
              pyVar13->tag = 0x14;
              pyVar13->uni = yVar3;
            }
            uVar17 = pyVar20->tag;
            if ((pyVar13 != (yyjson_mut_val *)0x0) && (((uint)uVar17 & 7) == 6)) {
              uVar16 = (uVar17 & 0xfffffffffffffffe) + 0x100;
              pyVar20->tag = uVar16;
              pyVar22 = pyVar13;
              if (0xff < uVar17) {
                pyVar22 = *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10);
                *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10) = pyVar13;
              }
              pyVar13->next = pyVar22;
              (pyVar20->uni).str = (char *)pyVar13;
              uVar17 = uVar16;
            }
          }
          if (((uint)uVar17 & 7) == 6) {
            yVar3 = *(yyjson_val_uni *)(p_Var21 + 0xd);
            pyVar13 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar13) {
              bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar9) {
                pyVar13 = pyVar1->cur;
                goto LAB_01dc4d5d;
              }
LAB_01dc51df:
              pyVar13 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_01dc4d5d:
              pyVar1->cur = pyVar13 + 1;
              if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_01dc51df;
              pyVar13->tag = 0x14;
              pyVar13->uni = yVar3;
            }
            uVar17 = pyVar20->tag;
            if ((pyVar13 != (yyjson_mut_val *)0x0) && (((uint)uVar17 & 7) == 6)) {
              uVar16 = (uVar17 & 0xfffffffffffffffe) + 0x100;
              pyVar20->tag = uVar16;
              pyVar22 = pyVar13;
              if (0xff < uVar17) {
                pyVar22 = *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10);
                *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10) = pyVar13;
              }
              pyVar13->next = pyVar22;
              (pyVar20->uni).str = (char *)pyVar13;
              uVar17 = uVar16;
            }
          }
          if (((uint)uVar17 & 7) == 6) {
            yVar3 = *(yyjson_val_uni *)(p_Var21 + 0xf);
            pyVar13 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar13) {
              bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (bVar9) {
                pyVar13 = pyVar1->cur;
                goto LAB_01dc4de0;
              }
LAB_01dc520d:
              pyVar13 = (yyjson_mut_val *)0x0;
            }
            else {
LAB_01dc4de0:
              pyVar1->cur = pyVar13 + 1;
              if (pyVar13 == (yyjson_mut_val *)0x0) goto LAB_01dc520d;
              pyVar13->tag = 0x14;
              pyVar13->uni = yVar3;
            }
            if ((pyVar13 != (yyjson_mut_val *)0x0) &&
               (uVar17 = pyVar20->tag, ((uint)uVar17 & 7) == 6)) {
              pyVar20->tag = (uVar17 & 0xfffffffffffffffe) + 0x100;
              pyVar22 = pyVar13;
              if (0xff < uVar17) {
                pyVar22 = *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10);
                *(yyjson_mut_val **)((pyVar20->uni).u64 + 0x10) = pyVar13;
              }
              pyVar13->next = pyVar22;
              (pyVar20->uni).str = (char *)pyVar13;
            }
          }
        }
      }
    } while (p_Var21[0x11]._M_nxt == (_Hash_node_base *)0x0);
    pyVar18 = duckdb_yyjson::yyjson_read_opts
                        ((char *)p_Var21[0x10]._M_nxt,(usize)p_Var21[0x11]._M_nxt,0,
                         (yyjson_alc *)0x0,(yyjson_read_err *)0x0);
    if (pyVar18 == (yyjson_doc *)0x0) {
      duckdb_yyjson::yyjson_mut_doc_free(doc);
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&kv,"Failed to parse CRS JSON",(allocator *)&local_c8);
      InvalidInputException::InvalidInputException(this_00,(string *)&kv);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pyVar13 = duckdb_yyjson::yyjson_val_mut_copy(doc,pyVar18->root);
    if (doc == (yyjson_mut_doc *)0x0) {
LAB_01dc511e:
      pyVar20 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar20 = (doc->val_pool).cur;
      if ((doc->val_pool).end == pyVar20) {
        bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
        if (bVar9) {
          pyVar20 = pyVar1->cur;
          goto LAB_01dc4e98;
        }
        pyVar20 = (yyjson_mut_val *)0x0;
      }
      else {
LAB_01dc4e98:
        pyVar1->cur = pyVar20 + 1;
      }
      pyVar2 = local_a0;
      pcVar14 = (doc->str_pool).cur;
      if ((ulong)((long)(doc->str_pool).end - (long)pcVar14) < 9) {
        bVar9 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(local_a0,alc,9);
        if (!bVar9) goto LAB_01dc511e;
        pcVar14 = pyVar2->cur;
      }
      pyVar2->cur = pcVar14 + 9;
      if (pcVar14 == (char *)0x0) goto LAB_01dc511e;
      builtin_strncpy(pcVar14,"projjson",9);
      if (pyVar20 == (yyjson_mut_val *)0x0) goto LAB_01dc511e;
      pyVar20->tag = 0x80d;
      (pyVar20->uni).str = pcVar14;
    }
    if (((((char)local_d0 == '\0') && (uVar17 = local_f8->tag, (~(uint)uVar17 & 7) == 0)) &&
        (pyVar20 != (yyjson_mut_val *)0x0)) &&
       ((pyVar13 != (yyjson_mut_val *)0x0 && (((uint)pyVar20->tag & 7) == 5)))) {
      pyVar22 = pyVar20;
      if (0xff < uVar17) {
        lVar5 = *(long *)((local_f8->uni).u64 + 0x10);
        pyVar22 = *(yyjson_mut_val **)(lVar5 + 0x10);
        *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar20;
      }
      pyVar13->next = pyVar22;
      pyVar20->next = pyVar13;
      (local_f8->uni).str = (char *)pyVar20;
      local_f8->tag = (uVar17 & 0xff) + (uVar17 & 0xffffffffffffff00) + 0x100;
    }
    p_Var6 = (pyVar18->alc).free;
    pvVar7 = (pyVar18->alc).ctx;
    (pyVar18->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
    (pyVar18->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
    (pyVar18->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    (pyVar18->alc).ctx = (void *)0x0;
    if (pyVar18->str_pool != (char *)0x0) {
      (*p_Var6)(pvVar7,pyVar18->str_pool);
    }
    (*p_Var6)(pvVar7,pyVar18);
  } while( true );
}

Assistant:

void GeoParquetFileMetadata::Write(duckdb_parquet::FileMetaData &file_meta_data) const {

	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	// Add the version
	yyjson_mut_obj_add_strncpy(doc, root, "version", version.c_str(), version.size());

	// Add the primary column
	yyjson_mut_obj_add_strncpy(doc, root, "primary_column", primary_geometry_column.c_str(),
	                           primary_geometry_column.size());

	// Add the columns
	const auto json_columns = yyjson_mut_obj_add_obj(doc, root, "columns");

	for (auto &column : geometry_columns) {
		const auto column_json = yyjson_mut_obj_add_obj(doc, json_columns, column.first.c_str());
		yyjson_mut_obj_add_str(doc, column_json, "encoding", "WKB");
		const auto geometry_types = yyjson_mut_obj_add_arr(doc, column_json, "geometry_types");
		for (auto &geometry_type : column.second.geometry_types) {
			const auto type_name = WKBGeometryTypes::ToString(geometry_type);
			yyjson_mut_arr_add_str(doc, geometry_types, type_name);
		}
		const auto bbox = yyjson_mut_obj_add_arr(doc, column_json, "bbox");
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_y);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_y);

		// If the CRS is present, add it
		if (!column.second.projjson.empty()) {
			const auto crs_doc = yyjson_read(column.second.projjson.c_str(), column.second.projjson.size(), 0);
			if (!crs_doc) {
				yyjson_mut_doc_free(doc);
				throw InvalidInputException("Failed to parse CRS JSON");
			}
			const auto crs_root = yyjson_doc_get_root(crs_doc);
			const auto crs_val = yyjson_val_mut_copy(doc, crs_root);
			const auto crs_key = yyjson_mut_strcpy(doc, "projjson");
			yyjson_mut_obj_add(column_json, crs_key, crs_val);
			yyjson_doc_free(crs_doc);
		}
	}

	yyjson_write_err err;
	size_t len;
	char *json = yyjson_mut_write_opts(doc, 0, nullptr, &len, &err);
	if (!json) {
		yyjson_mut_doc_free(doc);
		throw SerializationException("Failed to write JSON string: %s", err.msg);
	}

	// Create a string from the JSON
	duckdb_parquet::KeyValue kv;
	kv.__set_key("geo");
	kv.__set_value(string(json, len));

	// Free the JSON and the document
	free(json);
	yyjson_mut_doc_free(doc);

	file_meta_data.key_value_metadata.push_back(kv);
	file_meta_data.__isset.key_value_metadata = true;
}